

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.h
# Opt level: O0

void __thiscall File::AddIncludeStmt(File *this,bool withPointyBrackets,string *filename)

{
  byte in_SIL;
  long in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> *__x;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_40;
  byte local_9;
  
  local_9 = in_SIL & 1;
  __x = &local_40;
  std::make_pair<std::__cxx11::string_const&,bool&>(&__x->first,(bool *)(in_RDI + 0x20));
  std::
  map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
  ::insert<std::pair<std::__cxx11::string,bool>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),__x);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
         *)0x178f9d);
  return;
}

Assistant:

void AddIncludeStmt(bool withPointyBrackets, const std::string& filename) {
        rawIncludes.insert(std::make_pair(filename, withPointyBrackets));
    }